

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O3

void Abc_NtkMultiCone_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone)

{
  size_t __size;
  int iVar1;
  ulong uVar2;
  void **ppvVar3;
  long lVar4;
  
  uVar2 = (ulong)pNode & 1;
  while( true ) {
    if (uVar2 != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMulti.c"
                    ,0x26a,"void Abc_NtkMultiCone_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0x1f) != 7) break;
    Abc_NtkMultiCone_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vCone);
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]];
    uVar2 = (ulong)pNode & 1;
  }
  iVar1 = vCone->nSize;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if ((Abc_Obj_t *)vCone->pArray[lVar4] == pNode) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (iVar1 == vCone->nCap) {
    if (iVar1 < 0x10) {
      if (vCone->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vCone->pArray,0x80);
      }
      vCone->pArray = ppvVar3;
      vCone->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vCone->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vCone->pArray,__size);
      }
      vCone->pArray = ppvVar3;
      vCone->nCap = iVar1 * 2;
    }
  }
  else {
    ppvVar3 = vCone->pArray;
  }
  iVar1 = vCone->nSize;
  vCone->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pNode;
  return;
}

Assistant:

void Abc_NtkMultiCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->fMarkA || !Abc_ObjIsNode(pNode) )
    {
        Vec_PtrPushUnique( vCone, pNode );
        return;
    }
    Abc_NtkMultiCone_rec( Abc_ObjFanin(pNode,0), vCone );
    Abc_NtkMultiCone_rec( Abc_ObjFanin(pNode,1), vCone );
}